

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderVkImpl::Initialize
          (ShaderVkImpl *this,ShaderCreateInfo *ShaderCI,CreateInfo *VkShaderCI)

{
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 *Args;
  string *EntryPoint;
  SHADER_TYPE SVar1;
  IDXCompiler *pIVar2;
  RenderDeviceInfo *pRVar3;
  char *__s;
  char *pcVar4;
  SPIRVShaderResources *this_00;
  pointer puVar5;
  Version VVar6;
  Version VVar7;
  Version VVar8;
  Version VVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  SpirvVersion SVar12;
  uint uVar13;
  int iVar14;
  IMemoryAllocator *Allocator;
  undefined4 extraout_var;
  char (*Args_1) [50];
  ShaderDesc *shaderDesc;
  BuildGLSLSourceStringAttribs *extraout_RDX;
  BuildGLSLSourceStringAttribs *extraout_RDX_00;
  BuildGLSLSourceStringAttribs *Attribs;
  BuildGLSLSourceStringAttribs *extraout_RDX_01;
  BuildGLSLSourceStringAttribs *extraout_RDX_02;
  BuildGLSLSourceStringAttribs *extraout_RDX_03;
  ShaderMacro *pSVar15;
  size_t sVar16;
  pointer puVar17;
  pointer *ppuVar18;
  char (*in_R8) [23];
  Char *CombinedSamplerSuffix;
  undefined4 uVar19;
  undefined4 uVar20;
  string GLSLSourceString;
  string msg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  undefined1 local_e8 [32];
  Uint32 UStack_c8;
  Uint32 UStack_c4;
  Uint32 UStack_c0;
  Uint32 UStack_bc;
  SpirvVersion SStack_b8;
  Uint32 UStack_b4;
  Uint32 UStack_b0;
  undefined4 local_ac;
  bool local_a8;
  bool local_a7;
  char *local_a0;
  undefined8 local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  String local_58;
  STDDeleter<Diligent::SPIRVShaderResources,_Diligent::IMemoryAllocator> local_38;
  
  Args_1 = (char (*) [50])((ulong)ShaderCI->FilePath | (ulong)ShaderCI->Source);
  if (Args_1 == (char (*) [50])0x0) {
    if (ShaderCI->ByteCode == (void *)0x0) {
      LogError<true,char[93]>
                (false,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                 ,0xd3,(char (*) [93])
                       "Shader source must be provided through one of the \'Source\', \'FilePath\' or \'ByteCode\' members"
                );
    }
    else {
      Args = &ShaderCI->field_4;
      sVar16 = (ShaderCI->field_4).SourceLength;
      if (sVar16 == 0) {
        FormatString<char[27]>((string *)local_e8,(char (*) [27])"ByteCodeSize must not be 0");
        DebugAssertionFailed
                  ((Char *)local_e8._0_8_,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xcc);
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
        sVar16 = Args->SourceLength;
      }
      if ((sVar16 & 3) != 0) {
        FormatString<char[17],unsigned_long,char[23]>
                  ((string *)local_e8,(Diligent *)"Byte code size (",(char (*) [17])Args,
                   (unsigned_long *)") is not multiple of 4",in_R8);
        DebugAssertionFailed
                  ((Char *)local_e8._0_8_,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xcd);
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
        sVar16 = Args->SourceLength;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_SPIRV,sVar16 >> 2);
      memcpy((this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start,ShaderCI->ByteCode,(ShaderCI->field_4).SourceLength);
    }
    goto LAB_00226c30;
  }
  Attribs = (BuildGLSLSourceStringAttribs *)VkShaderCI;
  if (ShaderCI->ByteCode != (void *)0x0) {
    FormatString<char[74]>
              ((string *)local_e8,
               (char (*) [74])
               "\'ByteCode\' must be null when shader is created from source code or a file");
    Args_1 = (char (*) [50])0xa9;
    DebugAssertionFailed
              ((Char *)local_e8._0_8_,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0xa9);
    Attribs = extraout_RDX;
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
      Attribs = extraout_RDX_00;
    }
  }
  if (ShaderCI->ShaderCompiler < SHADER_COMPILER_DXC) {
LAB_002267b1:
    if (ShaderCI->SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL) {
      if ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) !=
          SHADER_COMPILE_FLAG_NONE) {
        local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)local_108.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ << 8);
LAB_00226a49:
        local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8._8_8_ = VkShaderCI->AdapterInfo;
        pRVar3 = VkShaderCI->DeviceInfo;
        local_e8._16_8_ = &pRVar3->Features;
        local_e8._24_4_ = pRVar3->Type;
        VVar6 = (pRVar3->MaxShaderVersion).HLSL;
        VVar7 = (pRVar3->MaxShaderVersion).GLSL;
        VVar8 = (pRVar3->MaxShaderVersion).GLESSL;
        VVar9 = (pRVar3->MaxShaderVersion).MSL;
        local_e8._28_4_ = VVar6.Major;
        UStack_c8 = VVar6.Minor;
        UStack_c4 = VVar7.Major;
        UStack_c0 = VVar7.Minor;
        UStack_bc = VVar8.Major;
        SStack_b8 = VVar8.Minor;
        UStack_b4 = VVar9.Major;
        UStack_b0 = VVar9.Minor;
        local_ac = 0;
        local_a8 = true;
        local_a0 = "#ifndef VULKAN\n#   define VULKAN 1\n#endif\n\n";
        local_98 = 0;
        local_e8._0_8_ = ShaderCI;
        BuildGLSLSourceString_abi_cxx11_(&local_58,(Diligent *)local_e8,Attribs);
        std::__cxx11::string::operator=((string *)&local_108,(string *)&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(SHADER_TYPE)local_58._M_dataplus._M_p) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                   (SHADER_TYPE)local_58._M_dataplus._M_p),
                          (ulong)(local_58.field_2._M_allocated_capacity + 1));
        }
        puVar17 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_e8._0_8_ =
             local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uVar13 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)local_e8);
        UStack_c8 = 0;
        pSVar15 = (ShaderMacro *)0x0;
        local_e8._8_8_ = puVar17;
        puVar17 = (pointer)0x0;
        goto LAB_00226af9;
      }
      GLSLangUtils::HLSLtoSPIRV
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,ShaderCI,Vk100,
                 "#ifndef VULKAN\n#   define VULKAN 1\n#endif\n\n",VkShaderCI->ppCompilerOutput);
      local_58.field_2._M_allocated_capacity = local_e8._16_8_;
      local_88._0_4_ = local_e8._0_4_;
      local_88._4_4_ = local_e8._4_4_;
      uVar19 = local_e8._8_4_;
      uVar20 = local_e8._12_4_;
    }
    else {
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)local_108.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ << 8);
      if (ShaderCI->SourceLanguage != SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM) goto LAB_00226a49;
      ReadShaderSourceFile
                ((ShaderSourceFileData *)local_e8,ShaderCI->Source,(ShaderCI->field_4).SourceLength,
                 ShaderCI->pShaderSourceStreamFactory,ShaderCI->FilePath);
      pSVar15 = (ShaderCI->Macros).Elements;
      UStack_c8 = (ShaderCI->Macros).Count;
      puVar17 = (pointer)local_e8._0_8_;
      uVar13 = local_e8._16_4_;
LAB_00226af9:
      local_e8._0_4_ = (ShaderCI->Desc).ShaderType;
      local_e8._16_4_ = uVar13;
      SStack_b8 = Vk100;
      local_e8._24_4_ = SUB84(pSVar15,0);
      local_e8._28_4_ = (undefined4)((ulong)pSVar15 >> 0x20);
      local_a8 = true;
      local_a7 = (bool)((byte)(char)ShaderCI->CompileFlags >> 3 & 1);
      UStack_c0 = (Uint32)ShaderCI->pShaderSourceStreamFactory;
      UStack_bc = (Uint32)((ulong)ShaderCI->pShaderSourceStreamFactory >> 0x20);
      UStack_b0 = (Uint32)VkShaderCI->ppCompilerOutput;
      local_ac = (undefined4)((ulong)VkShaderCI->ppCompilerOutput >> 0x20);
      SVar12 = Vk120;
      if ((VkShaderCI->VkVersion < 0x402000) &&
         (SVar12 = SStack_b8, 0x400fff < VkShaderCI->VkVersion)) {
        SVar12 = VkShaderCI->HasSpirv14 + Vk110;
      }
      SStack_b8 = SVar12;
      GLSLangUtils::GLSLtoSPIRV
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
                 (GLSLtoSPIRVAttribs *)local_e8);
      local_88._0_4_ = (SHADER_TYPE)local_58._M_dataplus._M_p;
      local_88._4_4_ = local_58._M_dataplus._M_p._4_4_;
      uStack_80 = (undefined4)local_58._M_string_length;
      uStack_7c = local_58._M_string_length._4_4_;
      if (puVar17 != (pointer)0x0) {
        (**(code **)(*(long *)puVar17 + 0x10))(puVar17);
      }
      uVar19 = uStack_80;
      uVar20 = uStack_7c;
      if ((pointer *)
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        uVar19 = uStack_80;
        uVar20 = uStack_7c;
      }
    }
    ppuVar18 = (pointer *)
               (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    puVar17 = (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(SHADER_TYPE *)
     &(this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (SHADER_TYPE)local_88;
    *(undefined4 *)
     ((long)&(this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start + 4) = local_88._4_4_;
    *(undefined4 *)
     &(this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = uVar19;
    *(undefined4 *)
     ((long)&(this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish + 4) = uVar20;
    (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_58.field_2._M_allocated_capacity;
    if (ppuVar18 != (pointer *)0x0) {
LAB_00226be7:
      operator_delete(ppuVar18,(long)puVar17 - (long)ppuVar18);
    }
  }
  else {
    if (ShaderCI->ShaderCompiler == SHADER_COMPILER_DXC) {
      if ((VkShaderCI->pDXCompiler == (IDXCompiler *)0x0) ||
         (iVar14 = (*VkShaderCI->pDXCompiler->_vptr_IDXCompiler[3])(), (char)iVar14 == '\0')) {
        FormatString<char[57]>
                  ((string *)local_e8,
                   (char (*) [57])"DX Compiler is not loaded. Using default shader compiler");
        Attribs = extraout_RDX_01;
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,local_e8._0_8_,0,0,0);
          Attribs = extraout_RDX_02;
        }
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
          Attribs = extraout_RDX_03;
        }
        goto LAB_002267b1;
      }
      pIVar2 = VkShaderCI->pDXCompiler;
      if ((pIVar2 == (IDXCompiler *)0x0) ||
         (iVar14 = (*pIVar2->_vptr_IDXCompiler[3])(pIVar2), (char)iVar14 == '\0')) {
        FormatString<char[26],char[50]>
                  ((string *)local_e8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pDXCompiler != nullptr && pDXCompiler->IsLoaded()",Args_1);
        DebugAssertionFailed
                  ((Char *)local_e8._0_8_,"CompileShaderDXC",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0x48);
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
      }
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*pIVar2->_vptr_IDXCompiler[6])
                (pIVar2,ShaderCI,ShaderCI->HLSLVersion,
                 "#ifndef VULKAN\n#   define VULKAN 1\n#endif\n\n",0,&local_108,
                 VkShaderCI->ppCompilerOutput);
      if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,&local_108,
                      SPV_ENV_MAX,SPIRV_OPTIMIZATION_FLAG_LEGALIZATION);
        uVar11 = local_e8._8_8_;
        uVar10 = local_e8._0_8_;
        puVar5 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar17 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_e8._0_8_ == local_e8._8_8_) {
          LogError<false,char[93]>
                    (false,"CompileShaderDXC",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                     ,0x55,(char (*) [93])
                           "Failed to legalize SPIR-V shader generated from HLSL. This may result in undefined behavior."
                    );
        }
        else {
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_e8._0_8_;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._16_8_;
          local_e8._0_8_ = (pointer)0x0;
          local_e8._8_8_ = (pointer *)0x0;
          local_e8._16_8_ = (DeviceFeatures *)0x0;
          if (puVar17 == (pointer)0x0) goto LAB_00226e82;
          operator_delete(puVar17,(long)puVar5 - (long)puVar17);
        }
        if ((pointer)local_e8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
        }
      }
LAB_00226e82:
      puVar17 = (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar5 = (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((puVar17 == (pointer)0x0) ||
         (operator_delete(puVar17,(long)puVar5 - (long)puVar17),
         puVar17 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,
         ppuVar18 = (pointer *)
                    local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
         (pointer *)
         local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start == (pointer *)0x0)) goto LAB_00226bef;
      goto LAB_00226be7;
    }
    LogError<true,char[28]>
              (false,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0xc2,(char (*) [28])"Unsupported shader compiler");
  }
LAB_00226bef:
  if ((this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_e8[0] = 0x27;
    LogError<true,char[27],char_const*,char>
              (false,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,199,(char (*) [27])"Failed to compile shader \'",
               (char **)&(this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                         .m_Desc,local_e8);
  }
LAB_00226c30:
  if ((this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_SKIP_REFLECTION) == SHADER_COMPILE_FLAG_NONE)
    {
      Allocator = GetRawAllocator();
      iVar14 = (**Allocator->_vptr_IMemoryAllocator)
                         (Allocator,0x58,"Memory for SPIRVShaderResources",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                         );
      SVar1 = (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
              .m_Desc.ShaderType;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)Allocator;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(extraout_var,iVar14);
      local_88 = &this->m_SPIRV;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,&this->m_SPIRV);
      shaderDesc = &(this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                    .m_Desc;
      if ((this->super_ShaderBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
          .m_Desc.UseCombinedTextureSamplers == false) {
        CombinedSamplerSuffix = (char *)0x0;
      }
      else {
        CombinedSamplerSuffix =
             (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
             .m_Desc.CombinedSamplerSuffix;
      }
      EntryPoint = &this->m_EntryPoint;
      SPIRVShaderResources::SPIRVShaderResources
                ((SPIRVShaderResources *)CONCAT44(extraout_var,iVar14),Allocator,&local_70,
                 shaderDesc,CombinedSamplerSuffix,SVar1 == SHADER_TYPE_VERTEX,
                 ShaderCI->LoadConstantBufferReflection,EntryPoint);
      if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (((ShaderCI->ByteCode == (void *)0x0) &&
          (iVar14 = std::__cxx11::string::compare((char *)EntryPoint), iVar14 != 0)) &&
         ((iVar14 = std::__cxx11::string::compare((char *)EntryPoint), iVar14 != 0 ||
          ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) ==
           SHADER_COMPILE_FLAG_NONE)))) {
        FormatString<char[26],char[173]>
                  ((string *)local_e8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ShaderCI.ByteCode != nullptr || m_EntryPoint == ShaderCI.EntryPoint || (m_EntryPoint == \"main\" && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) != 0)"
                   ,(char (*) [173])shaderDesc);
        DebugAssertionFailed
                  ((Char *)local_e8._0_8_,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xf0);
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
      }
      puVar17 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.m_Allocator = Allocator;
      std::__shared_ptr<Diligent::SPIRVShaderResources_const,(__gnu_cxx::_Lock_policy)2>::
      reset<Diligent::SPIRVShaderResources,Diligent::STDDeleter<Diligent::SPIRVShaderResources,Diligent::IMemoryAllocator>>
                ((__shared_ptr<Diligent::SPIRVShaderResources_const,(__gnu_cxx::_Lock_policy)2> *)
                 &this->m_pShaderResources,(SPIRVShaderResources *)puVar17,&local_38);
      if ((SVar1 == SHADER_TYPE_VERTEX) &&
         (this_00 = (this->m_pShaderResources).
                    super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr, this_00->m_IsHLSLSource == true)) {
        SPIRVShaderResources::MapHLSLVertexShaderInputs(this_00,local_88);
      }
      if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                  ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&local_108,
                   local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      }
    }
    else {
      __s = ShaderCI->EntryPoint;
      pcVar4 = (char *)(this->m_EntryPoint)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&this->m_EntryPoint,0,pcVar4,(ulong)__s);
    }
    LOCK();
    (this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i = SHADER_STATUS_READY;
    UNLOCK();
  }
  return;
}

Assistant:

void ShaderVkImpl::Initialize(const ShaderCreateInfo& ShaderCI,
                              const CreateInfo&       VkShaderCI)
{
    if (ShaderCI.Source != nullptr || ShaderCI.FilePath != nullptr)
    {
        DEV_CHECK_ERR(ShaderCI.ByteCode == nullptr, "'ByteCode' must be null when shader is created from source code or a file");

        SHADER_COMPILER ShaderCompiler = ShaderCI.ShaderCompiler;
        if (ShaderCompiler == SHADER_COMPILER_DXC)
        {
            IDXCompiler* pDXCompiler = VkShaderCI.pDXCompiler;
            if (pDXCompiler == nullptr || !pDXCompiler->IsLoaded())
            {
                LOG_WARNING_MESSAGE("DX Compiler is not loaded. Using default shader compiler");
                ShaderCompiler = SHADER_COMPILER_DEFAULT;
            }
        }

        switch (ShaderCompiler)
        {
            case SHADER_COMPILER_DXC:
                m_SPIRV = CompileShaderDXC(ShaderCI, VkShaderCI);
                break;

            case SHADER_COMPILER_DEFAULT:
            case SHADER_COMPILER_GLSLANG:
                m_SPIRV = CompileShaderGLSLang(ShaderCI, VkShaderCI);
                break;

            default:
                LOG_ERROR_AND_THROW("Unsupported shader compiler");
        }

        if (m_SPIRV.empty())
        {
            LOG_ERROR_AND_THROW("Failed to compile shader '", m_Desc.Name, '\'');
        }
    }
    else if (ShaderCI.ByteCode != nullptr)
    {
        DEV_CHECK_ERR(ShaderCI.ByteCodeSize != 0, "ByteCodeSize must not be 0");
        DEV_CHECK_ERR(ShaderCI.ByteCodeSize % 4 == 0, "Byte code size (", ShaderCI.ByteCodeSize, ") is not multiple of 4");
        m_SPIRV.resize(ShaderCI.ByteCodeSize / 4);
        memcpy(m_SPIRV.data(), ShaderCI.ByteCode, ShaderCI.ByteCodeSize);
    }
    else
    {
        LOG_ERROR_AND_THROW("Shader source must be provided through one of the 'Source', 'FilePath' or 'ByteCode' members");
    }

    // We cannot create shader module here because resource bindings are assigned when
    // pipeline state is created

    // Load shader resources
    if (!m_SPIRV.empty())
    {
        if ((ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_SKIP_REFLECTION) == 0)
        {
            IMemoryAllocator& Allocator = GetRawAllocator();

            std::unique_ptr<void, STDDeleterRawMem<void>> pRawMem{
                ALLOCATE(Allocator, "Memory for SPIRVShaderResources", SPIRVShaderResources, 1),
                STDDeleterRawMem<void>(Allocator),
            };
            const bool LoadShaderInputs = m_Desc.ShaderType == SHADER_TYPE_VERTEX;
            new (pRawMem.get()) SPIRVShaderResources // May throw
                {
                    Allocator,
                    m_SPIRV,
                    m_Desc,
                    m_Desc.UseCombinedTextureSamplers ? m_Desc.CombinedSamplerSuffix : nullptr,
                    LoadShaderInputs,
                    ShaderCI.LoadConstantBufferReflection,
                    m_EntryPoint //
                };
            VERIFY_EXPR(ShaderCI.ByteCode != nullptr || m_EntryPoint == ShaderCI.EntryPoint ||
                        (m_EntryPoint == "main" && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) != 0));
            m_pShaderResources.reset(static_cast<SPIRVShaderResources*>(pRawMem.release()), STDDeleterRawMem<SPIRVShaderResources>(Allocator));

            if (LoadShaderInputs && m_pShaderResources->IsHLSLSource())
            {
                m_pShaderResources->MapHLSLVertexShaderInputs(m_SPIRV);
            }
        }
        else
        {
            m_EntryPoint = ShaderCI.EntryPoint;
        }

        m_Status.store(SHADER_STATUS_READY);
    }
}